

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

pair_type __thiscall
booster::locale::gnu_gettext::mo_message<char>::get_string
          (mo_message<char> *this,int domain_id,char_type *context,char_type *in_id)

{
  pointer pmVar1;
  mo_file *this_00;
  pair_type pVar2;
  const_iterator cVar3;
  _Rb_tree<booster::locale::gnu_gettext::message_key<char>,_std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  _Base_ptr p_Var4;
  ulong uVar5;
  char *pcVar6;
  pair_type pVar7;
  pair_type pVar8;
  key_type key;
  
  if (-1 < domain_id) {
    uVar5 = (ulong)(uint)domain_id;
    pmVar1 = (this->catalogs_).
             super__Vector_base<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 < (ulong)(((long)(this->catalogs_).
                               super__Vector_base<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1) / 0x30)) {
      this_00 = (this->mo_catalogs_).
                super__Vector_base<std::shared_ptr<booster::locale::gnu_gettext::mo_file>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::mo_file>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar5].
                super___shared_ptr<booster::locale::gnu_gettext::mo_file,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if (this_00 != (mo_file *)0x0) {
        pVar7 = mo_file::find(this_00,context,in_id);
        pVar8.first = pVar7.first;
        pVar8.second = pVar7.second;
        return pVar8;
      }
      key.context_._M_dataplus._M_p = (pointer)&key.context_.field_2;
      key.context_._M_string_length = 0;
      key.context_.field_2._M_local_buf[0] = '\0';
      key.key_._M_dataplus._M_p = (pointer)&key.key_.field_2;
      key.key_._M_string_length = 0;
      key.key_.field_2._M_local_buf[0] = '\0';
      if (context == (char_type *)0x0) {
        context = "";
      }
      this_01 = &pmVar1[uVar5]._M_t;
      key.c_context_ = context;
      key.c_key_ = in_id;
      cVar3 = std::
              _Rb_tree<booster::locale::gnu_gettext::message_key<char>,_std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(this_01,&key);
      if ((_Rb_tree_header *)cVar3._M_node == &(this_01->_M_impl).super__Rb_tree_header) {
        p_Var4 = (_Base_ptr)0x0;
        pcVar6 = (char *)0x0;
      }
      else {
        p_Var4 = cVar3._M_node[3]._M_left;
        pcVar6 = (char *)((long)&p_Var4->_M_color + (long)&(cVar3._M_node[3]._M_right)->_M_color);
      }
      pVar2.second = pcVar6;
      pVar2.first = (char *)p_Var4;
      message_key<char>::~message_key(&key);
      return pVar2;
    }
  }
  return (pair_type)ZEXT816(0);
}

Assistant:

pair_type get_string(int domain_id,char_type const *context,char_type const *in_id) const
                {
                    pair_type null_pair((CharType const *)0,(CharType const *)0);
                    if(domain_id < 0 || size_t(domain_id) >= catalogs_.size())
                        return null_pair;
                    if(mo_file_use_traits<char_type>::in_use && mo_catalogs_[domain_id]) {
                        return mo_file_use_traits<char_type>::use(*mo_catalogs_[domain_id],context,in_id);
                    }
                    else {
                        key_type key(context,in_id);
                        catalog_type const &cat = catalogs_[domain_id];
                        typename catalog_type::const_iterator p = cat.find(key);
                        if(p==cat.end()) {
                            return null_pair;
                        }
                        return pair_type(p->second.data(),p->second.data()+p->second.size());
                    }
                }